

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O0

Localtime * muduo::detail::findLocaltime(Data *data,Transition sentry,Comp comp)

{
  bool bVar1;
  const_reference pvVar2;
  const_iterator __first;
  const_iterator __last;
  reference rhs;
  pointer pTVar3;
  vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_> *pvVar4;
  const_reference pvVar5;
  undefined1 in_SIL;
  long in_RDI;
  const_iterator transI;
  Localtime *local;
  vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>
  *in_stack_ffffffffffffffa8;
  vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>
  *in_stack_ffffffffffffffb0;
  Transition *in_stack_ffffffffffffffc0;
  __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
  local_20;
  undefined8 local_18;
  long local_10;
  Comp local_1;
  
  local_18 = 0;
  local_10 = in_RDI;
  local_1.compareGmt = (bool)in_SIL;
  bVar1 = std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>::empty
                    ((vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>
                      *)in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pvVar2 = std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>::
             front((vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_> *)
                   in_stack_ffffffffffffffb0);
    bVar1 = Comp::operator()(&local_1,(Transition *)&stack0x00000008,pvVar2);
    if (!bVar1) {
      __first = std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>::
                begin(in_stack_ffffffffffffffa8);
      __last = std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>::
               end(in_stack_ffffffffffffffa8);
      local_20 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<muduo::detail::Transition_const*,std::vector<muduo::detail::Transition,std::allocator<muduo::detail::Transition>>>,muduo::detail::Transition,muduo::detail::Comp>
                           (__first._M_current,__last._M_current,in_stack_ffffffffffffffc0,local_1);
      std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>::end
                (in_stack_ffffffffffffffa8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) {
        pvVar4 = (vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_> *)
                 (local_10 + 0x18);
        pvVar2 = std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>
                 ::back((vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>
                         *)in_stack_ffffffffffffffb0);
        pvVar5 = std::vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>::
                 operator[](pvVar4,(long)pvVar2->localtimeIdx);
        return pvVar5;
      }
      rhs = __gnu_cxx::
            __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
            ::operator*(&local_20);
      bVar1 = Comp::equal(&local_1,(Transition *)&stack0x00000008,rhs);
      if (!bVar1) {
        __gnu_cxx::
        __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
        ::operator--(&local_20);
      }
      pvVar4 = (vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_> *)
               (local_10 + 0x18);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_muduo::detail::Transition_*,_std::vector<muduo::detail::Transition,_std::allocator<muduo::detail::Transition>_>_>
               ::operator->(&local_20);
      pvVar5 = std::vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>::
               operator[](pvVar4,(long)pTVar3->localtimeIdx);
      return pvVar5;
    }
  }
  pvVar5 = std::vector<muduo::detail::Localtime,_std::allocator<muduo::detail::Localtime>_>::front
                     (in_stack_ffffffffffffffb0);
  return pvVar5;
}

Assistant:

const Localtime* findLocaltime(const TimeZone::Data& data, Transition sentry, Comp comp)
{
  const Localtime* local = NULL;

  if (data.transitions.empty() || comp(sentry, data.transitions.front()))
  {
    // FIXME: should be first non dst time zone
    local = &data.localtimes.front();
  }
  else
  {
    vector<Transition>::const_iterator transI = lower_bound(data.transitions.begin(),
                                                            data.transitions.end(),
                                                            sentry,
                                                            comp);
    if (transI != data.transitions.end())
    {
      if (!comp.equal(sentry, *transI))
      {
        assert(transI != data.transitions.begin());
        --transI;
      }
      local = &data.localtimes[transI->localtimeIdx];
    }
    else
    {
      // FIXME: use TZ-env
      local = &data.localtimes[data.transitions.back().localtimeIdx];
    }
  }

  return local;
}